

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_create.cpp
# Opt level: O1

void __thiscall
ktx::CommandCreate::checkSpecsMatch
          (CommandCreate *this,ImageInput *currentFile,ImageSpec *firstSpec)

{
  float *pfVar1;
  float fVar2;
  byte bVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *pcVar8;
  size_t sVar9;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  long lVar10;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  Reporter *this_00;
  uint uVar11;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  aVar12;
  Origin *o;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  string_view fmt_03;
  string_view fmt_04;
  string_view fmt_05;
  string_view fmt_06;
  string_view fmt_07;
  string_view fmt_08;
  string_view fmt_09;
  string_view fmt_10;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  format_args args_03;
  format_args args_04;
  format_args args_05;
  format_args args_06;
  format_args args_07;
  format_args args_08;
  format_args args_09;
  format_args args_10;
  string firstGamma;
  string currentGamma;
  string local_98;
  string local_78;
  Reporter *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_50;
  ulong local_48 [3];
  uint *puVar7;
  undefined4 extraout_var_08;
  
  aVar12.values_ = (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_98;
  iVar5 = (*currentFile->_vptr_ImageInput[0xe])(currentFile);
  puVar7 = (uint *)CONCAT44(extraout_var,iVar5);
  if (((*(uint *)&(firstSpec->formatDesc).basic ^ *puVar7) & 0xff0000) != 0) {
    if ((this->options).super_OptionsCreate.assignTF.
        super__Optional_base<_khr_df_transfer_e,_true,_true>._M_payload.
        super__Optional_payload_base<_khr_df_transfer_e>._M_engaged == true) {
      iVar5 = (*currentFile->_vptr_ImageInput[0xd])(currentFile);
      local_58 = (Reporter *)CONCAT44(extraout_var_00,iVar5);
      bVar3 = *(byte *)((long)puVar7 + 2);
      pcVar8 = (char *)dfdToStringTransferFunction(bVar3);
      if (pcVar8 == (char *)0x0) {
        local_98._M_dataplus._M_p = (pointer)(ulong)bVar3;
        fmt.size_ = 2;
        fmt.data_ = (char *)0xa;
        args.field_1.values_ = in_R9.values_;
        args.desc_ = (unsigned_long_long)&local_98;
        ::fmt::v10::vformat_abi_cxx11_(&local_78,(v10 *)"(0x{:02X})",fmt,args);
        aVar12 = in_R9;
      }
      else {
        local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
        sVar9 = strlen(pcVar8);
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,pcVar8,pcVar8 + sVar9);
        aVar12 = in_R9;
      }
      bVar3 = (firstSpec->formatDesc).basic.field_0x2;
      pcVar8 = (char *)dfdToStringTransferFunction(bVar3);
      if (pcVar8 == (char *)0x0) {
        local_48[0] = (ulong)bVar3;
        fmt_00.size_ = 2;
        fmt_00.data_ = (char *)0xa;
        args_00.field_1.values_ = aVar12.values_;
        args_00.desc_ = (unsigned_long_long)local_48;
        ::fmt::v10::vformat_abi_cxx11_(&local_98,(v10 *)"(0x{:02X})",fmt_00,args_00);
      }
      else {
        local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
        sVar9 = strlen(pcVar8);
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,pcVar8,pcVar8 + sVar9);
      }
      Reporter::
      warning<char_const(&)[152],std::__cxx11::string_const&,std::__cxx11::string,std::__cxx11::string>
                (&(this->super_Command).super_Reporter,
                 (char (*) [152])
                 "Input image \"{}\" has different transfer function ({}) than the first image ({}) but will be treated identically as specified by the --assign-tf option."
                 ,&local_58->commandName,&local_78,&local_98);
    }
    else {
      bVar4 = (this->options).super_OptionsCreate.convertTF.
              super__Optional_base<_khr_df_transfer_e,_true,_true>._M_payload.
              super__Optional_payload_base<_khr_df_transfer_e>._M_engaged;
      local_58 = &(this->super_Command).super_Reporter;
      iVar5 = (*currentFile->_vptr_ImageInput[0xd])(currentFile);
      local_50 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(extraout_var_01,iVar5);
      if (bVar4 == true) {
        bVar3 = *(byte *)((long)puVar7 + 2);
        pcVar8 = (char *)dfdToStringTransferFunction((uint)bVar3);
        if (pcVar8 == (char *)0x0) {
          local_98._M_dataplus._M_p = (pointer)(ulong)(uint)bVar3;
          fmt_01.size_ = 2;
          fmt_01.data_ = (char *)0xa;
          args_01.field_1.values_ = in_R9.values_;
          args_01.desc_ = (unsigned_long_long)&local_98;
          ::fmt::v10::vformat_abi_cxx11_(&local_78,(v10 *)"(0x{:02X})",fmt_01,args_01);
          aVar12 = in_R9;
        }
        else {
          local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
          sVar9 = strlen(pcVar8);
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,pcVar8,pcVar8 + sVar9)
          ;
          aVar12 = in_R9;
        }
        uVar11 = (uint)(byte)(firstSpec->formatDesc).basic.field_0x2;
        pcVar8 = (char *)dfdToStringTransferFunction(uVar11);
        if (pcVar8 == (char *)0x0) {
          local_48[0] = (ulong)uVar11;
          fmt_03.size_ = 2;
          fmt_03.data_ = (char *)0xa;
          args_03.field_1.values_ = aVar12.values_;
          args_03.desc_ = (unsigned_long_long)local_48;
          ::fmt::v10::vformat_abi_cxx11_(&local_98,(v10 *)"(0x{:02X})",fmt_03,args_03);
        }
        else {
          local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
          sVar9 = strlen(pcVar8);
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,pcVar8,pcVar8 + sVar9)
          ;
        }
        Reporter::
        warning<char_const(&)[214],std::__cxx11::string_const&,std::__cxx11::string,std::__cxx11::string>
                  (local_58,(char (*) [214])
                            "Input image \"{}\" has different transfer function ({}) than the first image ({}) and thus will go through different transfer function conversion to the target transfer function specified by the --convert-tf option."
                   ,local_50,&local_78,&local_98);
      }
      else {
        bVar3 = *(byte *)((long)puVar7 + 2);
        pcVar8 = (char *)dfdToStringTransferFunction((uint)bVar3);
        if (pcVar8 == (char *)0x0) {
          local_98._M_dataplus._M_p = (pointer)(ulong)(uint)bVar3;
          fmt_02.size_ = 2;
          fmt_02.data_ = (char *)0xa;
          args_02.field_1.values_ = in_R9.values_;
          args_02.desc_ = (unsigned_long_long)&local_98;
          ::fmt::v10::vformat_abi_cxx11_(&local_78,(v10 *)"(0x{:02X})",fmt_02,args_02);
        }
        else {
          local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
          sVar9 = strlen(pcVar8);
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,pcVar8,pcVar8 + sVar9)
          ;
        }
        uVar11 = (uint)(byte)(firstSpec->formatDesc).basic.field_0x2;
        pcVar8 = (char *)dfdToStringTransferFunction(uVar11);
        if (pcVar8 == (char *)0x0) {
          local_48[0] = (ulong)uVar11;
          fmt_04.size_ = 2;
          fmt_04.data_ = (char *)0xa;
          args_04.field_1.values_ = in_R9.values_;
          args_04.desc_ = (unsigned_long_long)local_48;
          ::fmt::v10::vformat_abi_cxx11_(&local_98,(v10 *)"(0x{:02X})",fmt_04,args_04);
        }
        else {
          local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
          sVar9 = strlen(pcVar8);
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,pcVar8,pcVar8 + sVar9)
          ;
        }
        Reporter::
        fatal<char_const(&)[154],std::__cxx11::string_const&,std::__cxx11::string,std::__cxx11::string>
                  (local_58,INVALID_FILE,
                   (char (*) [154])
                   "Input image \"{}\" has different transfer function ({}) than the first image ({}). Use --assign-tf or --convert-tf to specify handling and stop this error."
                   ,local_50,&local_78,&local_98);
      }
    }
    in_R9 = aVar12;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      in_R9 = aVar12;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
  }
  fVar2 = (float)puVar7[6];
  pfVar1 = &(firstSpec->formatDesc).extended.oeGamma;
  if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
    if ((fVar2 != -1.0) || (NAN(fVar2))) {
      __gnu_cxx::__to_xstring<std::__cxx11::string,char>
                (&local_78,vsnprintf,0x3a,"%f",(double)fVar2);
      aVar12 = in_R9;
    }
    else {
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"no gamma","");
      aVar12 = in_R9;
    }
    fVar2 = (firstSpec->formatDesc).extended.oeGamma;
    if ((fVar2 != -1.0) || (NAN(fVar2))) {
      __gnu_cxx::__to_xstring<std::__cxx11::string,char>
                (&local_98,vsnprintf,0x3a,"%f",(double)fVar2);
    }
    else {
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"no gamma","");
    }
    in_R9.values_ = (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_98;
    if ((this->options).super_OptionsCreate.assignTF.
        super__Optional_base<_khr_df_transfer_e,_true,_true>._M_payload.
        super__Optional_payload_base<_khr_df_transfer_e>._M_engaged == true) {
      iVar5 = (*currentFile->_vptr_ImageInput[0xd])(currentFile);
      Reporter::
      warning<char_const(&)[140],std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&>
                (&(this->super_Command).super_Reporter,
                 (char (*) [140])
                 "Input image \"{}\" has different gamma ({}) than the first image ({}) but will be treated identically as specified by the --assign-tf option."
                 ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  CONCAT44(extraout_var_02,iVar5),&local_78,&local_98);
      in_R9 = aVar12;
    }
    else if ((this->options).super_OptionsCreate.convertTF.
             super__Optional_base<_khr_df_transfer_e,_true,_true>._M_payload.
             super__Optional_payload_base<_khr_df_transfer_e>._M_engaged == true) {
      iVar5 = (*currentFile->_vptr_ImageInput[0xd])(currentFile);
      Reporter::
      warning<char_const(&)[202],std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&>
                (&(this->super_Command).super_Reporter,
                 (char (*) [202])
                 "Input image \"{}\" has different gamma ({}) than the first image ({}) and thus will go through different transfer function conversion to the target transfer function specified by the --convert-tf option."
                 ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  CONCAT44(extraout_var_03,iVar5),&local_78,&local_98);
      in_R9 = aVar12;
    }
    else {
      iVar5 = (*currentFile->_vptr_ImageInput[0xd])(currentFile);
      Reporter::
      fatal<char_const(&)[142],std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&>
                (&(this->super_Command).super_Reporter,INVALID_FILE,
                 (char (*) [142])
                 "Input image \"{}\" has different gamma ({}) than the first image ({}). Use --assign-tf or --convert-tf to specify handling and stop this error."
                 ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  CONCAT44(extraout_var_04,iVar5),&local_78,&local_98);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
  }
  if (((*(uint *)&(firstSpec->formatDesc).basic ^ *puVar7) & 0xff00) != 0) {
    if ((this->options).super_OptionsCreate.assignPrimaries.
        super__Optional_base<_khr_df_primaries_e,_true,_true>._M_payload.
        super__Optional_payload_base<_khr_df_primaries_e>._M_engaged == true) {
      iVar5 = (*currentFile->_vptr_ImageInput[0xd])(currentFile);
      local_58 = (Reporter *)CONCAT44(extraout_var_05,iVar5);
      bVar3 = *(byte *)((long)puVar7 + 1);
      pcVar8 = (char *)dfdToStringColorPrimaries(bVar3);
      if (pcVar8 == (char *)0x0) {
        local_98._M_dataplus._M_p = (pointer)(ulong)bVar3;
        fmt_05.size_ = 2;
        fmt_05.data_ = (char *)0xa;
        args_05.field_1.values_ = in_R9.values_;
        args_05.desc_ = (unsigned_long_long)&local_98;
        ::fmt::v10::vformat_abi_cxx11_(&local_78,(v10 *)"(0x{:02X})",fmt_05,args_05);
      }
      else {
        local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
        sVar9 = strlen(pcVar8);
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,pcVar8,pcVar8 + sVar9);
      }
      bVar3 = (firstSpec->formatDesc).basic.field_0x1;
      pcVar8 = (char *)dfdToStringColorPrimaries(bVar3);
      if (pcVar8 == (char *)0x0) {
        local_48[0] = (ulong)bVar3;
        fmt_06.size_ = 2;
        fmt_06.data_ = (char *)0xa;
        args_06.field_1.values_ = in_R9.values_;
        args_06.desc_ = (unsigned_long_long)local_48;
        ::fmt::v10::vformat_abi_cxx11_(&local_98,(v10 *)"(0x{:02X})",fmt_06,args_06);
      }
      else {
        local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
        sVar9 = strlen(pcVar8);
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,pcVar8,pcVar8 + sVar9);
      }
      Reporter::
      warning<char_const(&)[151],std::__cxx11::string_const&,std::__cxx11::string,std::__cxx11::string>
                (&(this->super_Command).super_Reporter,
                 (char (*) [151])
                 "Input image \"{}\" has different primaries ({}) than the first image ({}) but will be treated identically as specified by the --assign-primaries option."
                 ,&local_58->commandName,&local_78,&local_98);
    }
    else {
      bVar4 = (this->options).super_OptionsCreate.convertPrimaries.
              super__Optional_base<_khr_df_primaries_e,_true,_true>._M_payload.
              super__Optional_payload_base<_khr_df_primaries_e>._M_engaged;
      local_58 = &(this->super_Command).super_Reporter;
      iVar5 = (*currentFile->_vptr_ImageInput[0xd])(currentFile);
      local_50 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(extraout_var_06,iVar5);
      if (bVar4 == true) {
        bVar3 = *(byte *)((long)puVar7 + 1);
        pcVar8 = (char *)dfdToStringColorPrimaries((uint)bVar3);
        if (pcVar8 == (char *)0x0) {
          local_98._M_dataplus._M_p = (pointer)(ulong)(uint)bVar3;
          fmt_07.size_ = 2;
          fmt_07.data_ = (char *)0xa;
          args_07.field_1.values_ = in_R9.values_;
          args_07.desc_ = (unsigned_long_long)&local_98;
          ::fmt::v10::vformat_abi_cxx11_(&local_78,(v10 *)"(0x{:02X})",fmt_07,args_07);
        }
        else {
          local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
          sVar9 = strlen(pcVar8);
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,pcVar8,pcVar8 + sVar9)
          ;
        }
        uVar11 = (uint)(byte)(firstSpec->formatDesc).basic.field_0x1;
        pcVar8 = (char *)dfdToStringColorPrimaries(uVar11);
        if (pcVar8 == (char *)0x0) {
          local_48[0] = (ulong)uVar11;
          fmt_09.size_ = 2;
          fmt_09.data_ = (char *)0xa;
          args_09.field_1.values_ = in_R9.values_;
          args_09.desc_ = (unsigned_long_long)local_48;
          ::fmt::v10::vformat_abi_cxx11_(&local_98,(v10 *)"(0x{:02X})",fmt_09,args_09);
        }
        else {
          local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
          sVar9 = strlen(pcVar8);
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,pcVar8,pcVar8 + sVar9)
          ;
        }
        Reporter::
        warning<char_const(&)[197],std::__cxx11::string_const&,std::__cxx11::string,std::__cxx11::string>
                  (local_58,(char (*) [197])
                            "Input image \"{}\" has different primaries ({}) than the first image ({}) and thus will go through different primaries conversion to the target primaries specified by the --convert-primaries option."
                   ,local_50,&local_78,&local_98);
      }
      else {
        bVar3 = *(byte *)((long)puVar7 + 1);
        pcVar8 = (char *)dfdToStringColorPrimaries((uint)bVar3);
        if (pcVar8 == (char *)0x0) {
          local_98._M_dataplus._M_p = (pointer)(ulong)(uint)bVar3;
          fmt_08.size_ = 2;
          fmt_08.data_ = (char *)0xa;
          args_08.field_1.values_ = in_R9.values_;
          args_08.desc_ = (unsigned_long_long)&local_98;
          ::fmt::v10::vformat_abi_cxx11_(&local_78,(v10 *)"(0x{:02X})",fmt_08,args_08);
        }
        else {
          local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
          sVar9 = strlen(pcVar8);
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,pcVar8,pcVar8 + sVar9)
          ;
        }
        uVar11 = (uint)(byte)(firstSpec->formatDesc).basic.field_0x1;
        pcVar8 = (char *)dfdToStringColorPrimaries(uVar11);
        if (pcVar8 == (char *)0x0) {
          local_48[0] = (ulong)uVar11;
          fmt_10.size_ = 2;
          fmt_10.data_ = (char *)0xa;
          args_10.field_1.values_ = in_R9.values_;
          args_10.desc_ = (unsigned_long_long)local_48;
          ::fmt::v10::vformat_abi_cxx11_(&local_98,(v10 *)"(0x{:02X})",fmt_10,args_10);
        }
        else {
          local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
          sVar9 = strlen(pcVar8);
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,pcVar8,pcVar8 + sVar9)
          ;
        }
        Reporter::
        fatal<char_const(&)[160],std::__cxx11::string_const&,std::__cxx11::string,std::__cxx11::string>
                  (local_58,INVALID_FILE,
                   (char (*) [160])
                   "Input image \"{}\" has different primaries ({}) than the first image ({}). Use --assign-primaries or --convert-primaries to specify handling and stop this error."
                   ,local_50,&local_78,&local_98);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
  }
  if (puVar7[4] != (firstSpec->formatDesc).extended.channelCount) {
    iVar5 = (*currentFile->_vptr_ImageInput[0xd])(currentFile);
    Reporter::warning<char_const(&)[71],std::__cxx11::string_const&>
              (&(this->super_Command).super_Reporter,
               (char (*) [71])
               "Input image \"{}\" has a different component count than the first image.",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(extraout_var_07,iVar5));
  }
  iVar5 = (*currentFile->_vptr_ImageInput[0xe])(currentFile);
  lVar10 = CONCAT44(extraout_var_08,iVar5);
  if (((*(uint8_t *)(lVar10 + 0x7c) != (firstSpec->imageOrigin).x) ||
      (*(uint8_t *)(lVar10 + 0x7d) != (firstSpec->imageOrigin).y)) ||
     (*(uint8_t *)(lVar10 + 0x7e) != (firstSpec->imageOrigin).z)) {
    o = &firstSpec->imageOrigin;
    if ((this->options).super_OptionsCreate.assignTexcoordOrigin.
        super__Optional_base<ImageSpec::Origin,_true,_true>._M_payload.
        super__Optional_payload_base<ImageSpec::Origin>._M_engaged == true) {
      iVar5 = (*currentFile->_vptr_ImageInput[0xd])(currentFile);
      iVar6 = (*currentFile->_vptr_ImageInput[0xe])(currentFile);
      ::toString_abi_cxx11_(&local_78,(Origin *)(CONCAT44(extraout_var_10,iVar6) + 0x7c));
      ::toString_abi_cxx11_(&local_98,o);
      Reporter::
      warning<char_const(&)[163],std::__cxx11::string_const&,std::__cxx11::string,std::__cxx11::string>
                (&(this->super_Command).super_Reporter,
                 (char (*) [163])
                 "Input image \"{}\" has different texcoord origin ({}) than the first image ({}) but will be treated identically as specified by the --assign-texcoord-origin option."
                 ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  CONCAT44(extraout_var_09,iVar5),&local_78,&local_98);
    }
    else {
      bVar4 = (this->options).super_OptionsCreate.convertTexcoordOrigin.
              super__Optional_base<ImageSpec::Origin,_true,_true>._M_payload.
              super__Optional_payload_base<ImageSpec::Origin>._M_engaged;
      this_00 = &(this->super_Command).super_Reporter;
      iVar5 = (*currentFile->_vptr_ImageInput[0xd])(currentFile);
      if (bVar4 == true) {
        iVar6 = (*currentFile->_vptr_ImageInput[0xe])(currentFile);
        ::toString_abi_cxx11_(&local_78,(Origin *)(CONCAT44(extraout_var_12,iVar6) + 0x7c));
        ::toString_abi_cxx11_(&local_98,o);
        Reporter::
        warning<char_const(&)[203],std::__cxx11::string_const&,std::__cxx11::string,std::__cxx11::string>
                  (this_00,(char (*) [203])
                           "Input image \"{}\" has different texcoord origin ({}) than the first image ({}) and thus will go through different origin conversion to the target origin specified by the --convert-texcoord-origin option."
                   ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    CONCAT44(extraout_var_11,iVar5),&local_78,&local_98);
      }
      else {
        iVar6 = (*currentFile->_vptr_ImageInput[0xe])(currentFile);
        ::toString_abi_cxx11_(&local_78,(Origin *)(CONCAT44(extraout_var_13,iVar6) + 0x7c));
        ::toString_abi_cxx11_(&local_98,o);
        Reporter::
        fatal<char_const(&)[178],std::__cxx11::string_const&,std::__cxx11::string,std::__cxx11::string>
                  (this_00,INVALID_FILE,
                   (char (*) [178])
                   "Input image \"{}\" has different texcoord origin ({}) than the first image ({}). Use --assign-texcoord-origin or --convert-texcoord-origin to specify handling and stop this error."
                   ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    CONCAT44(extraout_var_11,iVar5),&local_78,&local_98);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void CommandCreate::checkSpecsMatch(const ImageInput& currentFile, const ImageSpec& firstSpec) {
    const FormatDescriptor& firstFormat = firstSpec.format();
    const FormatDescriptor& currentFormat = currentFile.spec().format();

    if (currentFormat.transfer() != firstFormat.transfer()) {
        if (options.assignTF.has_value()) {
            warning("Input image \"{}\" has different transfer function ({}) than the first image ({})"
                " but will be treated identically as specified by the --assign-tf option.",
                currentFile.filename(), toString(currentFormat.transfer()), toString(firstFormat.transfer()));
        } else if (options.convertTF.has_value()) {
            warning("Input image \"{}\" has different transfer function ({}) than the first image ({})"
                " and thus will go through different transfer function conversion to the target transfer"
                " function specified by the --convert-tf option.",
                currentFile.filename(), toString(currentFormat.transfer()), toString(firstFormat.transfer()));
        } else {
            fatal(rc::INVALID_FILE, "Input image \"{}\" has different transfer function ({}) than the first image ({})."
                " Use --assign-tf or --convert-tf to specify handling and stop this error.",
                currentFile.filename(), toString(currentFormat.transfer()), toString(firstFormat.transfer()));
        }
    }

    if (currentFormat.oeGamma() != firstFormat.oeGamma()) {
        auto currentGamma = currentFormat.oeGamma() != -1 ? std::to_string(currentFormat.oeGamma()) : "no gamma";
        auto firstGamma = firstFormat.oeGamma() != -1 ? std::to_string(firstFormat.oeGamma()) : "no gamma";
        if (options.assignTF.has_value()) {
            warning("Input image \"{}\" has different gamma ({}) than the first image ({})"
                " but will be treated identically as specified by the --assign-tf option.",
                currentFile.filename(), currentGamma, firstGamma);
        } else if (options.convertTF.has_value()) {
            warning("Input image \"{}\" has different gamma ({}) than the first image ({})"
                " and thus will go through different transfer function conversion to the target transfer"
                " function specified by the --convert-tf option.",
                currentFile.filename(), currentGamma, firstGamma);
        } else {
            fatal(rc::INVALID_FILE, "Input image \"{}\" has different gamma ({}) than the first image ({})."
                " Use --assign-tf or --convert-tf to specify handling and stop this error.",
                currentFile.filename(), currentGamma, firstGamma);
        }
    }

    if (currentFormat.primaries() != firstFormat.primaries()) {
        if (options.assignPrimaries.has_value()) {
            warning("Input image \"{}\" has different primaries ({}) than the first image ({})"
                " but will be treated identically as specified by the --assign-primaries option.",
                currentFile.filename(), toString(currentFormat.primaries()), toString(firstFormat.primaries()));
        } else if (options.convertPrimaries.has_value()) {
            warning("Input image \"{}\" has different primaries ({}) than the first image ({})"
                " and thus will go through different primaries conversion to the target primaries"
                " specified by the --convert-primaries option.",
                currentFile.filename(), toString(currentFormat.primaries()), toString(firstFormat.primaries()));
        } else {
            fatal(rc::INVALID_FILE, "Input image \"{}\" has different primaries ({}) than the first image ({})."
                " Use --assign-primaries or --convert-primaries to specify handling and stop this error.",
                currentFile.filename(), toString(currentFormat.primaries()), toString(firstFormat.primaries()));
        }
    }

    if (currentFormat.channelCount() != firstFormat.channelCount()) {
        warning("Input image \"{}\" has a different component count than the first image.", currentFile.filename());
    }

    if (currentFile.spec().origin() != firstSpec.origin()) {
        if (options.assignTexcoordOrigin.has_value()) {
            warning("Input image \"{}\" has different texcoord origin ({}) than the first image ({})"
                " but will be treated identically as specified by the --assign-texcoord-origin option.",
                currentFile.filename(), toString(currentFile.spec().origin()), toString(firstSpec.origin()));
        } else if (options.convertTexcoordOrigin.has_value()) {
            warning("Input image \"{}\" has different texcoord origin ({}) than the first image ({})"
                " and thus will go through different origin conversion to the target origin"
                " specified by the --convert-texcoord-origin option.",
                currentFile.filename(), toString(currentFile.spec().origin()), toString(firstSpec.origin()));
        } else {
            fatal(rc::INVALID_FILE, "Input image \"{}\" has different texcoord origin ({}) than the first image ({})."
                " Use --assign-texcoord-origin or --convert-texcoord-origin to specify handling and stop this error.",
                currentFile.filename(), toString(currentFile.spec().origin()), toString(firstSpec.origin()));
        }
    }
}